

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O1

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArraySet
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,ArraySet *curr,
          optional<wasm::HeapType> ht)

{
  Type local_40 [2];
  _Storage<wasm::HeapType,_true> local_30;
  char local_28;
  
  local_30 = ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  local_28 = ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_engaged;
  if (((undefined1  [16])
       ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    local_30._M_value = wasm::Type::getHeapType(&curr->ref->type);
    if (local_28 == '\0') {
      local_28 = '\x01';
    }
  }
  HeapType::getArray((HeapType *)local_40);
  if (((uint)(0x7c < (ulong)local_30) * 4 + 3 & local_30._0_4_) == 0) {
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,&curr->ref,(Type)((ulong)local_30 | 2));
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,&curr->index,(Type)0x2);
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,&curr->value,local_40[0]);
    return;
  }
  __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
}

Assistant:

void visitArraySet(ArraySet* curr,
                     std::optional<HeapType> ht = std::nullopt) {
    if (!ht) {
      ht = curr->ref->type.getHeapType();
    }
    auto type = ht->getArray().element.type;
    note(&curr->ref, Type(*ht, Nullable));
    note(&curr->index, Type::i32);
    note(&curr->value, type);
  }